

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_band.c
# Opt level: O0

void bandCopy(realtype **a,realtype **b,sunindextype n,sunindextype a_smu,sunindextype b_smu,
             sunindextype copymu,sunindextype copyml)

{
  realtype *prVar1;
  realtype *prVar2;
  realtype *b_col_j;
  realtype *a_col_j;
  sunindextype copySize;
  sunindextype j;
  sunindextype i;
  sunindextype copymu_local;
  sunindextype b_smu_local;
  sunindextype a_smu_local;
  sunindextype n_local;
  realtype **b_local;
  realtype **a_local;
  
  for (copySize = 0; copySize < n; copySize = copySize + 1) {
    prVar1 = a[copySize];
    prVar2 = b[copySize];
    for (j = 0; j < copymu + copyml + 1; j = j + 1) {
      prVar2[b_smu + (j - copymu)] = prVar1[a_smu + (j - copymu)];
    }
  }
  return;
}

Assistant:

void bandCopy(realtype **a, realtype **b, sunindextype n, sunindextype a_smu, sunindextype b_smu, 
              sunindextype copymu, sunindextype copyml)
{
  sunindextype i, j, copySize;
  realtype *a_col_j, *b_col_j;

  copySize = copymu + copyml + 1;
 
  for (j=0; j < n; j++) {
    a_col_j = a[j]+a_smu-copymu;
    b_col_j = b[j]+b_smu-copymu;
    for (i=0; i < copySize; i++)
      b_col_j[i] = a_col_j[i];
  }
}